

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.hpp
# Opt level: O2

void duckdb::roaring::RoaringStateAppender<duckdb::roaring::RoaringCompressState>::AppendVector
               (RoaringCompressState *state,Vector *input,idx_t input_size)

{
  validity_t entry;
  ulong uVar1;
  idx_t appended;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong amount;
  bool bVar6;
  ulong local_88;
  UnifiedVectorFormat unified;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&unified);
  Vector::ToUnifiedFormat(input,input_size,&unified);
  if (unified.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    for (uVar1 = 0; uVar2 = input_size - uVar1, uVar1 <= input_size && uVar2 != 0;
        uVar1 = uVar1 + uVar4) {
      uVar4 = 0x800 - ((ulong)(state->container_state).length +
                      (ulong)(state->container_state).appended_count);
      if (uVar2 <= uVar4) {
        uVar4 = uVar2;
      }
      RoaringCompressState::HandleAllValid(state,uVar4);
      if ((uint)(state->container_state).length + (uint)(state->container_state).appended_count ==
          0x800) {
        RoaringCompressState::NextContainer(state);
      }
    }
  }
  else {
    for (local_88 = 0; uVar1 = input_size - local_88, local_88 <= input_size && uVar1 != 0;
        local_88 = local_88 + uVar2) {
      uVar2 = 0x800 - ((ulong)(state->container_state).length +
                      (ulong)(state->container_state).appended_count);
      if (uVar1 <= uVar2) {
        uVar2 = uVar1;
      }
      uVar4 = local_88 >> 6;
      uVar1 = local_88 & 0x3f;
      if (uVar1 != 0) {
        uVar5 = 0xffffffffffffffff;
        if (unified.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          uVar5 = unified.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar4];
        }
        amount = 0x40 - uVar1;
        if (uVar2 < amount) {
          uVar3 = (ulong)(&ValidityUncompressed::UPPER_MASKS)[uVar2] >>
                  ((char)amount - (char)uVar2 & 0x3fU);
          amount = uVar2;
        }
        else {
          uVar3 = (&ValidityUncompressed::UPPER_MASKS)[amount];
        }
        uVar1 = (uVar3 & uVar5) >> (sbyte)uVar1;
        if (uVar1 == *(ulong *)(ValidityUncompressed::LOWER_MASKS + amount * 8)) {
          RoaringCompressState::HandleAllValid(state,amount);
        }
        else if (uVar1 == 0) {
          RoaringCompressState::HandleNoneValid(state,amount);
        }
        else {
          AppendBytes(state,uVar1,amount);
        }
        uVar2 = uVar2 - amount;
        local_88 = local_88 + amount;
        uVar4 = uVar4 + 1;
      }
      uVar1 = uVar2 >> 6;
      uVar5 = uVar4;
      while (bVar6 = uVar1 != 0, uVar1 = uVar1 - 1, bVar6) {
        if (unified.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
LAB_014c4529:
          RoaringCompressState::HandleAllValid(state,0x40);
        }
        else {
          entry = unified.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar5];
          if (entry == 0) {
            RoaringCompressState::HandleNoneValid(state,0x40);
          }
          else {
            if (entry == 0xffffffffffffffff) goto LAB_014c4529;
            AppendBytes(state,entry,0x40);
          }
        }
        uVar5 = uVar5 + 1;
      }
      uVar1 = uVar2 & 0x3f;
      if (uVar1 != 0) {
        uVar5 = 0xffffffffffffffff;
        if (unified.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          uVar5 = unified.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                  [uVar4 + (uVar2 >> 6)];
        }
        uVar4 = *(ulong *)(ValidityUncompressed::LOWER_MASKS + uVar1 * 8) & uVar5;
        if (uVar4 == *(ulong *)(ValidityUncompressed::LOWER_MASKS + uVar1 * 8)) {
          RoaringCompressState::HandleAllValid(state,uVar1);
        }
        else if (uVar4 == 0) {
          RoaringCompressState::HandleNoneValid(state,uVar1);
        }
        else {
          AppendBytes(state,uVar5,uVar1);
        }
      }
      if ((uint)(state->container_state).length + (uint)(state->container_state).appended_count ==
          0x800) {
        RoaringCompressState::NextContainer(state);
      }
    }
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(&unified);
  return;
}

Assistant:

static void AppendVector(STATE_TYPE &state, Vector &input, idx_t input_size) {
		UnifiedVectorFormat unified;
		input.ToUnifiedFormat(input_size, unified);
		auto &validity = unified.validity;

		if (validity.AllValid()) {
			// All bits are set implicitly
			idx_t appended = 0;
			while (appended < input_size) {
				idx_t to_append =
				    MinValue<idx_t>(ROARING_CONTAINER_SIZE - STATE_TYPE::Count(state), input_size - appended);
				STATE_TYPE::HandleAllValid(state, to_append);
				if (STATE_TYPE::Count(state) == ROARING_CONTAINER_SIZE) {
					STATE_TYPE::Flush(state);
				}
				appended += to_append;
			}
		} else {
			// There is a validity mask
			idx_t appended = 0;
			while (appended < input_size) {
				idx_t to_append =
				    MinValue<idx_t>(ROARING_CONTAINER_SIZE - STATE_TYPE::Count(state), input_size - appended);

				// Deal with a ragged start, when 'appended' isn't a multiple of ValidityMask::BITS_PER_VALUE
				// then we need to process the remainder of the entry
				idx_t entry_offset = appended / ValidityMask::BITS_PER_VALUE;
				auto previous_entry_remainder = appended % ValidityMask::BITS_PER_VALUE;
				if (DUCKDB_UNLIKELY(previous_entry_remainder != 0)) {
					auto validity_entry = validity.GetValidityEntry(entry_offset);

					idx_t to_process = ValidityMask::BITS_PER_VALUE - previous_entry_remainder;
					validity_t mask;
					if (to_append < to_process) {
						// Limit the amount of bits to set
						auto left_bits = to_process - to_append;
						to_process = to_append;
						mask = ValidityUncompressed::UPPER_MASKS[to_process] >> left_bits;
					} else {
						mask = ValidityUncompressed::UPPER_MASKS[to_process];
					}

					auto masked_entry = (validity_entry & mask) >> previous_entry_remainder;
					if (masked_entry == ValidityUncompressed::LOWER_MASKS[to_process]) {
						// All bits are set
						STATE_TYPE::HandleAllValid(state, to_process);
					} else if (masked_entry == 0) {
						// None of the bits are set
						STATE_TYPE::HandleNoneValid(state, to_process);
					} else {
						// Mixed set/unset bits
						AppendBytes(state, masked_entry, to_process);
					}

					to_append -= to_process;
					appended += to_process;
					entry_offset++;
				}

				auto entry_count = to_append / ValidityMask::BITS_PER_VALUE;
				for (idx_t entry_index = 0; entry_index < entry_count; entry_index++) {
					// get the validity entry at this index
					auto validity_entry = validity.GetValidityEntry(entry_offset + entry_index);
					if (ValidityMask::AllValid(validity_entry)) {
						// All bits are set
						STATE_TYPE::HandleAllValid(state, ValidityMask::BITS_PER_VALUE);
					} else if (ValidityMask::NoneValid(validity_entry)) {
						// None of the bits are set
						STATE_TYPE::HandleNoneValid(state, ValidityMask::BITS_PER_VALUE);
					} else {
						// Mixed set/unset bits
						AppendBytes(state, validity_entry, ValidityMask::BITS_PER_VALUE);
					}
				}

				// Deal with a ragged end, when the validity entry isn't entirely used
				idx_t remainder = to_append % ValidityMask::BITS_PER_VALUE;
				if (DUCKDB_UNLIKELY(remainder != 0)) {
					auto validity_entry = validity.GetValidityEntry(entry_offset + entry_count);
					auto masked = validity_entry & ValidityUncompressed::LOWER_MASKS[remainder];
					if (masked == ValidityUncompressed::LOWER_MASKS[remainder]) {
						// All bits are set
						STATE_TYPE::HandleAllValid(state, remainder);
					} else if (masked == 0) {
						// None of the bits are set
						STATE_TYPE::HandleNoneValid(state, remainder);
					} else {
						AppendBytes(state, validity_entry, remainder);
					}
				}

				if (STATE_TYPE::Count(state) == ROARING_CONTAINER_SIZE) {
					STATE_TYPE::Flush(state);
				}
				appended += to_append;
			}
		}
	}